

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O0

int Eso_ManFindDistOneLitNotEqual(int *pCube1,int *pCube2,int nLits)

{
  int local_30;
  int local_2c;
  int iDiff;
  int k;
  int i;
  int nLits_local;
  int *pCube2_local;
  int *pCube1_local;
  
  local_30 = -1;
  local_2c = 0;
  iDiff = 0;
  do {
    if (nLits <= iDiff) {
      if (local_30 == -1) {
        local_30 = nLits;
      }
      return local_30;
    }
    if (pCube1[iDiff] != pCube2[local_2c]) {
      if (local_30 != -1) {
        return -1;
      }
      local_30 = iDiff;
      iDiff = iDiff + -1;
    }
    iDiff = iDiff + 1;
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

int Eso_ManFindDistOneLitNotEqual( int * pCube1, int * pCube2, int nLits ) // pCube1 has nLits; pCube2 has nLits + 1
{
    int i, k, iDiff = -1;
    for ( i = k = 0; i < nLits; i++, k++ )
        if ( pCube1[i] != pCube2[k] )
        {
            if ( iDiff != -1 )
                return -1;
            iDiff = i;
            i--;
        }
    if ( iDiff == -1 )
        iDiff = nLits;
    return iDiff;
}